

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall
TTD::EventLog::RecordJsRTCreateTypeError
          (EventLog *this,TTDJsRTActionResultAutoRecorder *actionPopper,Var msg)

{
  EventLogEntry *actionEvent;
  EventLogEntry *evt;
  JsRTSingleVarArgumentAction *sAction;
  Var msg_local;
  TTDJsRTActionResultAutoRecorder *actionPopper_local;
  EventLog *this_local;
  
  evt = (EventLogEntry *)0x0;
  sAction = (JsRTSingleVarArgumentAction *)msg;
  msg_local = actionPopper;
  actionPopper_local = (TTDJsRTActionResultAutoRecorder *)this;
  actionEvent = RecordGetInitializedEvent<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)27>
                          (this,(JsRTVarsArgumentAction_InternalUse<1UL> **)&evt);
  NSLogEvents::SetVarItem_0<1ul>((JsRTVarsArgumentAction_InternalUse<1UL> *)evt,sAction);
  TTDJsRTActionResultAutoRecorder::InitializeWithEventAndEnterWResult
            ((TTDJsRTActionResultAutoRecorder *)msg_local,actionEvent,(TTDVar *)evt);
  return;
}

Assistant:

void EventLog::RecordJsRTCreateTypeError(TTDJsRTActionResultAutoRecorder& actionPopper, Js::Var msg)
    {
        NSLogEvents::JsRTSingleVarArgumentAction* sAction = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::JsRTSingleVarArgumentAction, NSLogEvents::EventKind::CreateTypeErrorActionTag>(&sAction);
        NSLogEvents::SetVarItem_0(sAction, TTD_CONVERT_JSVAR_TO_TTDVAR(msg));

        actionPopper.InitializeWithEventAndEnterWResult(evt, &(sAction->Result));
    }